

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eoclient.cpp
# Opt level: O2

void __thiscall
ActionQueue::AddAction(ActionQueue *this,PacketReader *reader,double time,bool auto_queue)

{
  ActionQueue_Action *this_00;
  ActionQueue_Action *local_50;
  PacketReader local_48;
  
  this_00 = (ActionQueue_Action *)operator_new(0x38);
  PacketReader::PacketReader(&local_48,reader);
  ActionQueue_Action::ActionQueue_Action(this_00,&local_48,time,auto_queue);
  local_50 = this_00;
  std::
  deque<std::unique_ptr<ActionQueue_Action,std::default_delete<ActionQueue_Action>>,std::allocator<std::unique_ptr<ActionQueue_Action,std::default_delete<ActionQueue_Action>>>>
  ::emplace_back<ActionQueue_Action*>
            ((deque<std::unique_ptr<ActionQueue_Action,std::default_delete<ActionQueue_Action>>,std::allocator<std::unique_ptr<ActionQueue_Action,std::default_delete<ActionQueue_Action>>>>
              *)this,&local_50);
  PacketReader::~PacketReader(&local_48);
  return;
}

Assistant:

void ActionQueue::AddAction(const PacketReader& reader, double time, bool auto_queue)
{
	this->queue.emplace(new ActionQueue_Action(reader, time, auto_queue));
}